

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<64>,unsigned_int>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  double dVar2;
  double dVar3;
  bool result;
  int i;
  uint h2;
  uint h1;
  Blob<64> k2;
  Blob<64> k1;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_ffffffffffffff4c;
  Rand *in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void *blob;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  byte bVar4;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffff7c;
  Blob<64> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffff90;
  Blob<64> local_68;
  int in_stack_ffffffffffffffa0;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffffa8;
  
  dVar2 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50
                     );
  blob = (void *)(dVar2 * (double)(int)in_EDX);
  dVar3 = pow(2.0,32.0);
  dVar3 = (double)blob / dVar3;
  Rand::Rand(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::vector
            ((vector<Blob<64>,_std::allocator<Blob<64>_>_> *)0x12d73b);
  Blob<64>::Blob(&local_68);
  Blob<64>::Blob((Blob<64> *)&stack0xffffffffffffff84);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",dVar2,
         (ulong)in_ESI,0x40,0x20);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         (void *)(dVar2 * (double)(int)in_EDX),dVar3,(ulong)in_EDX);
  iVar5 = 0;
  while (iVar5 < (int)in_EDX) {
    in_stack_ffffffffffffff64 = iVar5;
    iVar6 = iVar5;
    if (iVar5 % ((int)in_EDX / 10) == 0) {
      printf(".");
      in_stack_ffffffffffffff64 = iVar5;
    }
    Rand::rand_p((Rand *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),blob,
                 in_stack_ffffffffffffff64);
    Blob<64>::operator=((Blob<64> *)&stack0xffffffffffffff84,&local_68);
    (*in_RDI)(&local_68,8,0,&stack0xffffffffffffff80);
    DiffTestRecurse<Blob<64>,unsigned_int>
              ((pfHash)in_stack_ffffffffffffff90,
               (Blob<64> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff80,(uint *)CONCAT44(in_stack_ffffffffffffff7c,iVar6),
               (uint *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (int)((ulong)blob >> 0x20),in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
    iVar5 = iVar6 + 1;
  }
  printf("\n");
  bVar4 = 1;
  bVar1 = ProcessDifferentials<Blob<64>>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                     SUB41(in_stack_ffffffffffffff88,3));
  bVar4 = (bVar4 & 1 & bVar1) != 0;
  std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::~vector
            ((vector<Blob<64>,_std::allocator<Blob<64>_>_> *)
             CONCAT44(in_stack_ffffffffffffff64,
                      CONCAT13(bVar1,CONCAT12(bVar4,in_stack_ffffffffffffff60))));
  return (bool)(bVar4 & 1);
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}